

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solveLeft
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          SVectorBase<double> *rhs1,SSVectorBase<double> *rhs2)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *ridx;
  double *rhs;
  int *ridx2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  double *vec;
  double *vec2;
  int iVar8;
  long lVar9;
  Real eps;
  Real RVar10;
  
  (*this->solveTime->_vptr_Timer[3])();
  (this->ssvec).setupStatus = false;
  ridx = (this->ssvec).super_IdxSet.idx;
  rhs = (this->ssvec).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  iVar8 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx2 = (rhs2->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  eps = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar5 != pdVar6) {
    memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
  }
  iVar2 = rhs1->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar2) {
    lVar9 = 0;
    do {
      iVar3 = *(int *)((long)&rhs1->m_elem->idx + lVar9);
      dVar1 = *(double *)((long)&rhs1->m_elem->val + lVar9);
      RVar10 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar5 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS(dVar1) <= RVar10) {
        pdVar5[iVar3] = 0.0;
      }
      else {
        pdVar5[iVar3] = dVar1;
        piVar7 = (this->ssvec).super_IdxSet.idx;
        iVar4 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar4 + 1;
        piVar7[iVar4] = iVar3;
      }
      lVar9 = lVar9 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar9);
  }
  (this->ssvec).setupStatus = true;
  iVar2 = (this->ssvec).super_IdxSet.num;
  x->setupStatus = false;
  piVar7 = (x->super_IdxSet).idx;
  vec = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  vec2 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  rhs2->setupStatus = false;
  iVar8 = CLUFactor<double>::vSolveLeft2
                    (&this->super_CLUFactor<double>,eps,vec,piVar7,rhs,ridx,iVar2,vec2,
                     (rhs2->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,ridx2,iVar8);
  x->setupStatus = false;
  (x->super_IdxSet).num = iVar8;
  if (0 < iVar8) {
    x->setupStatus = true;
  }
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 2;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveLeft(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   const SVectorBase<R>& rhs1,
   SSVectorBase<R>&       rhs2) //const
{

   solveTime->start();

   int   n;
   R* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();
   int   rn   = rhs2.size();
   int*  ridx = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n = this->vSolveLeft2(epsilon, x.altValues(), x.altIndexMem(), svec, sidx, n,
                         y.get_ptr(), rhs2.altValues(), ridx, rn);

   // this will unsetup x
   x.setSize(n);

   if(n > 0)
      x.forceSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 2;
   solveTime->stop();
}